

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

void __thiscall llvm::sys::fs::TempFile::TempFile(TempFile *this,StringRef Name,int FD)

{
  StringRef local_20;
  
  local_20.Length = Name.Length;
  local_20.Data = Name.Data;
  this->Done = false;
  StringRef::str_abi_cxx11_(&this->TmpName,&local_20);
  this->FD = FD;
  return;
}

Assistant:

TempFile::TempFile(StringRef Name, int FD) : TmpName(Name), FD(FD) {}